

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::MaybeAppendDecimal(State *state,int val)

{
  char *str;
  int in_ESI;
  State *in_RDI;
  char *p;
  char buf [20];
  size_t kMaxLength;
  bool local_41;
  char *local_40;
  char local_38 [19];
  char local_25 [13];
  undefined8 local_18;
  int local_c;
  
  local_18 = 0x14;
  if (*(int *)&(in_RDI->parse_state).field_0xc < 0) {
    local_40 = local_25 + 1;
    local_c = in_ESI;
    do {
      str = local_40 + -1;
      local_40[-1] = (char)(local_c % 10) + '0';
      local_c = local_c / 10;
      local_41 = local_38 < str && local_c != 0;
      local_40 = str;
    } while (local_41);
    Append(in_RDI,str,0x14 - ((long)str - (long)local_38));
  }
  return true;
}

Assistant:

static bool MaybeAppendDecimal(State *state, int val) {
  // Max {32-64}-bit unsigned int is 20 digits.
  constexpr size_t kMaxLength = 20;
  char buf[kMaxLength];

  // We can't use itoa or sprintf as neither is specified to be
  // async-signal-safe.
  if (state->parse_state.append) {
    // We can't have a one-before-the-beginning pointer, so instead start with
    // one-past-the-end and manipulate one character before the pointer.
    char *p = &buf[kMaxLength];
    do {  // val=0 is the only input that should write a leading zero digit.
      *--p = static_cast<char>((val % 10) + '0');
      val /= 10;
    } while (p > buf && val != 0);

    // 'p' landed on the last character we set.  How convenient.
    Append(state, p, kMaxLength - static_cast<size_t>(p - buf));
  }

  return true;
}